

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::EnumFieldGenerator::GenerateMembers
          (EnumFieldGenerator *this,Printer *printer,bool param_2)

{
  bool bVar1;
  bool param_2_local;
  Printer *printer_local;
  EnumFieldGenerator *this_local;
  
  bVar1 = Params::generate_intdefs((this->super_FieldGenerator).params_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"$message_type_intdef$\n");
  }
  io::Printer::Print(printer,&this->variables_,"public $type$ $name$;\n");
  bVar1 = Params::generate_has((this->super_FieldGenerator).params_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"public boolean has$capitalized_name$;\n");
  }
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateMembers(io::Printer* printer, bool /* unused lazy_init */) const {
  if (params_.generate_intdefs()) {
    printer->Print(variables_, "$message_type_intdef$\n");
  }
  printer->Print(variables_, "public $type$ $name$;\n");

  if (params_.generate_has()) {
    printer->Print(variables_,
      "public boolean has$capitalized_name$;\n");
  }
}